

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::GregorianCalendar::handleComputeMonthStart
          (GregorianCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  int64_t iVar5;
  int16_t *piVar6;
  bool bVar7;
  int32_t month_local;
  
  if (0xb < (uint)month) {
    iVar3 = ClockMath::floorDivide((double)month,0xc,&month_local);
    eyear = eyear + iVar3;
  }
  bVar7 = (eyear & 3U) == 0;
  iVar5 = ClockMath::floorDivide((long)eyear + -1,4);
  iVar1 = this->fGregorianCutoverYear;
  this->fIsGregorian = iVar1 <= eyear;
  bVar2 = iVar1 <= eyear;
  if (this->fInvertGregorian != '\0') {
    bVar2 = eyear < iVar1;
    this->fIsGregorian = eyear < iVar1;
  }
  iVar3 = eyear * 0x16d + (int)iVar5 + 0x1a42e2;
  if (bVar2) {
    if ((eyear & 3U) == 0) {
      bVar7 = true;
      if (eyear % 100 == 0) {
        bVar7 = eyear % 400 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    iVar4 = Grego::gregorianShift(eyear);
    iVar3 = iVar3 + iVar4;
  }
  if ((long)month != 0) {
    piVar6 = kLeapNumDays;
    if (!bVar7) {
      piVar6 = kNumDays;
    }
    iVar3 = iVar3 + piVar6[month];
  }
  return iVar3;
}

Assistant:

int32_t GregorianCalendar::handleComputeMonthStart(int32_t eyear, int32_t month,

                                                   UBool /* useMonth */) const
{
    GregorianCalendar *nonConstThis = (GregorianCalendar*)this; // cast away const

    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        eyear += ClockMath::floorDivide(month, 12, month);
    }

    UBool isLeap = eyear%4 == 0;
    int64_t y = (int64_t)eyear-1;
    int64_t julianDay = 365*y + ClockMath::floorDivide(y, (int64_t)4) + (kJan1_1JulianDay - 3);

    nonConstThis->fIsGregorian = (eyear >= fGregorianCutoverYear);
#if defined (U_DEBUG_CAL)
    fprintf(stderr, "%s:%d: (hcms%d/%d) fIsGregorian %s, fInvertGregorian %s\n", 
        __FILE__, __LINE__, eyear,month, fIsGregorian?"T":"F", fInvertGregorian?"T":"F");
#endif
    if (fInvertGregorian) {
        nonConstThis->fIsGregorian = !fIsGregorian;
    }
    if (fIsGregorian) {
        isLeap = isLeap && ((eyear%100 != 0) || (eyear%400 == 0));
        // Add 2 because Gregorian calendar starts 2 days after
        // Julian calendar
        int32_t gregShift = Grego::gregorianShift(eyear);
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: (hcms%d/%d) gregorian shift of %d += %d\n", 
            __FILE__, __LINE__, eyear, month, julianDay, gregShift);
#endif
        julianDay += gregShift;
    }

    // At this point julianDay indicates the day BEFORE the first
    // day of January 1, <eyear> of either the Julian or Gregorian
    // calendar.

    if (month != 0) {
        julianDay += isLeap?kLeapNumDays[month]:kNumDays[month];
    }

    return static_cast<int32_t>(julianDay);
}